

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void cm_return_data_buf(CManager_conflict cm,CMbuffer cmb)

{
  FILE *pFVar1;
  void *pvVar2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  void *in_RSI;
  long in_RDI;
  timespec ts_1;
  CMbuffer tmp;
  CMbuffer last;
  timespec ts;
  timespec local_40;
  void *local_30;
  undefined8 in_stack_ffffffffffffffd8;
  void *pvVar6;
  CManager in_stack_ffffffffffffffe0;
  long local_18;
  
  *(int *)((long)in_RSI + 0x10) = *(int *)((long)in_RSI + 0x10) + -1;
  iVar3 = CMtrace_val[9];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar3 = CMtrace_init(in_stack_ffffffffffffffe0,
                         (CMTraceType)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = *(FILE **)(in_RDI + 0x120);
      _Var4 = getpid();
      pVar5 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffffe0);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffe0,local_18);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),
            "cm_return_data_buf buffer %p, callback %p, ref_count is now %d\n",in_RSI,
            *(undefined8 *)((long)in_RSI + 0x20),(ulong)*(uint *)((long)in_RSI + 0x10));
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  if ((*(int *)((long)in_RSI + 0x10) == 0) && (*(long *)((long)in_RSI + 0x20) != 0)) {
    local_30 = *(void **)(in_RDI + 0xe8);
    iVar3 = CMtrace_val[9];
    if (*(long *)(in_RDI + 0x120) == 0) {
      iVar3 = CMtrace_init(in_stack_ffffffffffffffe0,CMAlwaysTrace);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = *(FILE **)(in_RDI + 0x120);
        _Var4 = getpid();
        pVar5 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar5);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf(*(FILE **)(in_RDI + 0x120),"cm_return_data_buf --- Unlinking %p cmb\n",in_RSI);
    }
    fflush(*(FILE **)(in_RDI + 0x120));
    pvVar2 = local_30;
    pvVar6 = (void *)0x0;
    while (local_30 = pvVar2, local_30 != (void *)0x0) {
      if (local_30 == in_RSI) {
        if (pvVar6 == (void *)0x0) {
          *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)((long)local_30 + 0x18);
        }
        else {
          *(undefined8 *)((long)pvVar6 + 0x18) = *(undefined8 *)((long)local_30 + 0x18);
        }
        local_30 = *(void **)((long)local_30 + 0x18);
        (**(code **)((long)in_RSI + 0x20))(*(undefined8 *)((long)in_RSI + 0x28));
        free(in_RSI);
        return;
      }
      pvVar6 = local_30;
      pvVar2 = *(void **)((long)local_30 + 0x18);
    }
  }
  return;
}

Assistant:

extern void
 cm_return_data_buf(CManager cm, CMbuffer cmb)
 {
     cmb->ref_count--;
     CMtrace_out(cm, CMBufferVerbose, "cm_return_data_buf buffer %p, callback %p, ref_count is now %d\n", cmb, cmb->return_callback, cmb->ref_count);
     if ((cmb->ref_count == 0) && (cmb->return_callback != NULL)) {
	 CMbuffer last = NULL, tmp = cm->cm_buffer_list;
	 /* UNLINK */
	 CMtrace_out(cm, CMBufferVerbose, "cm_return_data_buf --- Unlinking %p cmb\n", cmb);
	 while (tmp != NULL) {
	     if (tmp != cmb) {
		 last = tmp;
		 tmp = tmp->next;
		 continue;
	     }
	     /* remove the buffer from CM's list */
	     if (last == NULL) {
		 cm->cm_buffer_list = tmp->next;
	     } else {
		 last->next = tmp->next;
	     }
	     tmp = tmp->next;
	     (cmb->return_callback)(cmb->return_callback_data);
	     free(cmb);
	     break;
	 }
     }
 }